

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void reset_rate_conversion_params(EOPLL *opll)

{
  EOPLL_RateConv *pEVar1;
  double f_out_00;
  double __x;
  double dVar2;
  double f_inp;
  double f_out;
  EOPLL *opll_local;
  
  f_out_00 = (double)opll->rate;
  __x = (double)opll->clk / 72.0;
  opll->out_time = 0.0;
  opll->out_step = __x;
  opll->inp_step = f_out_00;
  if (opll->conv != (EOPLL_RateConv *)0x0) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = (EOPLL_RateConv *)0x0;
  }
  dVar2 = floor(__x);
  if ((dVar2 != f_out_00) || (NAN(dVar2) || NAN(f_out_00))) {
    dVar2 = floor(__x + 0.5);
    if ((dVar2 != f_out_00) || (NAN(dVar2) || NAN(f_out_00))) {
      pEVar1 = EOPLL_RateConv_new(__x,f_out_00,2);
      opll->conv = pEVar1;
      goto LAB_00141fa7;
    }
  }
  opll->inp_step = opll->out_step;
LAB_00141fa7:
  if (opll->conv != (EOPLL_RateConv *)0x0) {
    EOPLL_RateConv_reset(opll->conv);
  }
  return;
}

Assistant:

static void reset_rate_conversion_params(EOPLL *opll) {
  const double f_out = opll->rate;
  const double f_inp = opll->clk / 72.0;

  opll->out_time = 0;
  opll->out_step = f_inp;
  opll->inp_step = f_out;

  if (opll->conv) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = NULL;
  }

  if (floor(f_inp) != f_out && floor(f_inp + 0.5) != f_out) {
    opll->conv = EOPLL_RateConv_new(f_inp, f_out, 2);
  } else {
    opll->inp_step = opll->out_step;
  }

  if (opll->conv) {
    EOPLL_RateConv_reset(opll->conv);
  }
}